

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O2

void __thiscall
highs::RbTree<HighsNodeQueue::SuboptimalNodeRbTree>::insertFixup
          (RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *this,LinkType z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long x;
  ulong uVar5;
  ulong *puVar6;
  long lVar7;
  ulong uVar8;
  
  lVar2 = this[2].rootNode[1];
  lVar3 = z * 0x90 + lVar2;
  while (uVar8 = *(ulong *)(lVar3 + 0x70) & 0x7fffffffffffffff, lVar3 = uVar8 - 1, uVar8 != 0) {
    lVar4 = lVar3 * 0x90;
    uVar8 = *(ulong *)(lVar2 + 0x70 + lVar4);
    if (-1 < (long)uVar8) break;
    uVar8 = uVar8 & 0x7fffffffffffffff;
    x = uVar8 - 1;
    lVar1 = *(long *)(uVar8 * 0x90 + -0x30 + lVar2);
    uVar5 = (ulong)(lVar1 == lVar3);
    lVar7 = *(long *)(uVar8 * 0x90 + lVar2 + -0x30 + uVar5 * 8);
    if ((lVar7 == -1) || (lVar7 = lVar7 * 0x90, -1 < *(long *)(lVar2 + 0x70 + lVar7))) {
      lVar7 = lVar3;
      if (z == *(long *)(lVar2 + lVar4 + 0x60 + uVar5 * 8)) {
        rotate(this,lVar3,(uint)(lVar1 != lVar3));
        lVar2 = this[2].rootNode[1];
        uVar5 = *(ulong *)(lVar2 + 0x70 + lVar4) & 0x7fffffffffffffff;
        uVar8 = *(ulong *)(uVar5 * 0x90 + -0x20 + lVar2) & 0x7fffffffffffffff;
        x = uVar8 - 1;
        lVar7 = uVar5 - 1;
        z = lVar3;
      }
      *(ulong *)(lVar2 + 0x70 + lVar7 * 0x90) = uVar8;
      puVar6 = (ulong *)(lVar2 + 0x70 + x * 0x90);
      *puVar6 = *puVar6 | 0x8000000000000000;
      rotate(this,x,(uint)(lVar1 == lVar3));
      lVar2 = this[2].rootNode[1];
    }
    else {
      puVar6 = (ulong *)(lVar2 + lVar7 + 0x70);
      *(ulong *)(lVar2 + lVar4 + 0x70) = uVar8;
      *puVar6 = *puVar6 & 0x7fffffffffffffff;
      puVar6 = (ulong *)(lVar2 + 0x70 + x * 0x90);
      *puVar6 = *puVar6 | 0x8000000000000000;
      z = x;
    }
    lVar3 = lVar2 + z * 0x90;
  }
  puVar6 = (ulong *)(lVar2 + 0x70 + *this->rootNode * 0x90);
  *puVar6 = *puVar6 & 0x7fffffffffffffff;
  return;
}

Assistant:

void insertFixup(LinkType z) {
    LinkType pZ = getParent(z);
    while (isRed(pZ)) {
      LinkType zGrandParent = getParent(pZ);
      assert(zGrandParent != kNoLink);

      Dir dir = Dir(getChild(zGrandParent, kLeft) == pZ);

      LinkType y = getChild(zGrandParent, dir);
      if (isRed(y)) {
        makeBlack(pZ);
        makeBlack(y);
        makeRed(zGrandParent);
        z = zGrandParent;
      } else {
        if (z == getChild(pZ, dir)) {
          z = pZ;
          rotate(z, opposite(dir));
          pZ = getParent(z);
          zGrandParent = getParent(pZ);
          assert(zGrandParent != kNoLink);
        }

        makeBlack(pZ);
        makeRed(zGrandParent);
        rotate(zGrandParent, dir);
      }

      pZ = getParent(z);
    }

    makeBlack(rootNode);
  }